

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::formata(CBString *this,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  int iVar2;
  bstring b;
  size_t sVar3;
  CBStringException *pCVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar5;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  CBStringException bstr__cppwrapper_exception;
  va_list arglist;
  CBStringException CStack_1b8;
  CBString *local_190;
  undefined8 local_188;
  string *local_180;
  undefined1 *local_178;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((this->super_tagbstring).mlen < 1) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"CBString::Write protection error","");
    CBStringException::CBStringException(&CStack_1b8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar4,&CStack_1b8);
    __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (fmt == (char *)0x0) {
    operator+=(this,"<NULL>");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"CBString::CBString::formata (NULL, ...) is erroneous.","");
    CBStringException::CBStringException(&CStack_1b8,&local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar4,&CStack_1b8);
    __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_190 = this;
  b = bfromcstr(anon_var_dwarf_350e4 + 0x10);
  if (b != (bstring)0x0) {
    sVar3 = strlen(fmt);
    iVar2 = (int)sVar3 * 2;
    iVar5 = 0x10;
    if (0x10 < iVar2) {
      iVar5 = iVar2;
    }
    iVar2 = balloc(b,iVar5 + 2);
    if (iVar2 == 0) {
      do {
        local_178 = local_e8;
        local_180 = &bstr__cppwrapper_exception.msg;
        local_188 = 0x3000000010;
        iVar2 = vsnprintf((char *)b->data,(long)(iVar5 + 1),fmt,&local_188);
        b->data[iVar5] = '\0';
        sVar3 = strlen((char *)b->data);
        b->slen = (int)sVar3;
        if ((int)sVar3 < iVar5) {
          operator+=(local_190,b);
          bdestroy(b);
          return;
        }
        bVar1 = iVar5 < iVar2;
        iVar5 = iVar5 * 2;
        if (bVar1) {
          iVar5 = iVar2;
        }
        iVar2 = balloc(b,iVar5 + 2);
      } while (iVar2 == 0);
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"CBString::CBString::format out of memory.","");
    CBStringException::CBStringException(&CStack_1b8,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar4,&CStack_1b8);
    __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"CBString::CBString::format out of memory.","");
  CBStringException::CBStringException(&CStack_1b8,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  pCVar4 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar4,&CStack_1b8);
  __cxa_throw(pCVar4,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::formata (const char * fmt, ...) {
	bstring b;
	va_list arglist;
	int r, n;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (fmt == NULL) {
		*this += "<NULL>";
		bstringThrow ("CBString::formata (NULL, ...) is erroneous.");
	} else {

		if ((b = bfromcstr ("")) == NULL) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
			bstringThrow ("CBString::format out of memory.");
#else
			*this += "<NULL>";
#endif
		} else {
			if ((n = (int) (2 * (strlen) (fmt))) < START_VSNBUFF) n = START_VSNBUFF;
			for (;;) {
				if (BSTR_OK != balloc (b, n + 2)) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
					bstringThrow ("CBString::format out of memory.");
#else
					b = bformat ("<NULL>");
					break;
#endif
				}

				va_start (arglist, fmt);
				exvsnprintf (r, (char *) b->data, n + 1, fmt, arglist);
				va_end (arglist);

				b->data[n] = '\0';
				b->slen = (int) (strlen) ((char *) b->data);

				if (b->slen < n) break;
				if (r > n) n = r; else n += n;
			}
			*this += *b;
			bdestroy (b);
		}
	}
}